

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS
ref_matrix_sqrt_abs_m(REF_DBL *m_upper_tri,REF_DBL *sqrt_m_upper_tri,REF_DBL *inv_sqrt_m_upper_tri)

{
  double local_c8;
  double local_c0;
  double local_b8;
  REF_DBL local_b0;
  REF_DBL local_a8;
  double local_a0;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rsb;
  REF_DBL d [12];
  REF_DBL *inv_sqrt_m_upper_tri_local;
  REF_DBL *sqrt_m_upper_tri_local;
  REF_DBL *m_upper_tri_local;
  
  d[0xb] = (REF_DBL)inv_sqrt_m_upper_tri;
  m_upper_tri_local._4_4_ = ref_matrix_diag_m(m_upper_tri,(REF_DBL *)&ref_private_macro_code_rss);
  if (m_upper_tri_local._4_4_ == 0) {
    if (((_ref_private_macro_code_rss < 0.0) || (d[0] < 0.0)) || (d[1] < 0.0)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             0x240,"ref_matrix_sqrt_abs_m","ABS(eigenvalues)");
      printf("eigs %24.15e %24.15e %24.15e\n",_ref_private_macro_code_rss,d[0],d[1]);
      ref_matrix_show_m(m_upper_tri);
    }
    if (_ref_private_macro_code_rss <= 0.0) {
      local_a0 = -_ref_private_macro_code_rss;
    }
    else {
      local_a0 = _ref_private_macro_code_rss;
    }
    _ref_private_macro_code_rss = local_a0;
    if (d[0] <= 0.0) {
      local_a8 = -d[0];
    }
    else {
      local_a8 = d[0];
    }
    d[0] = local_a8;
    if (d[1] <= 0.0) {
      local_b0 = -d[1];
    }
    else {
      local_b0 = d[1];
    }
    d[1] = local_b0;
    _ref_private_macro_code_rss = sqrt(local_a0);
    d[0] = sqrt(d[0]);
    d[1] = sqrt(d[1]);
    m_upper_tri_local._4_4_ =
         ref_matrix_form_m((REF_DBL *)&ref_private_macro_code_rss,sqrt_m_upper_tri);
    if (m_upper_tri_local._4_4_ == 0) {
      if (_ref_private_macro_code_rss * 1e+20 <= 0.0) {
        local_b8 = -(_ref_private_macro_code_rss * 1e+20);
      }
      else {
        local_b8 = _ref_private_macro_code_rss * 1e+20;
      }
      if (1.0 < local_b8) {
        _ref_private_macro_code_rss = 1.0 / _ref_private_macro_code_rss;
        if (d[0] * 1e+20 <= 0.0) {
          local_c0 = -(d[0] * 1e+20);
        }
        else {
          local_c0 = d[0] * 1e+20;
        }
        if (1.0 < local_c0) {
          d[0] = 1.0 / d[0];
          if (d[1] * 1e+20 <= 0.0) {
            local_c8 = -(d[1] * 1e+20);
          }
          else {
            local_c8 = d[1] * 1e+20;
          }
          if (1.0 < local_c8) {
            d[1] = 1.0 / d[1];
            m_upper_tri_local._4_4_ =
                 ref_matrix_form_m((REF_DBL *)&ref_private_macro_code_rss,(REF_DBL *)d[0xb]);
            if (m_upper_tri_local._4_4_ == 0) {
              m_upper_tri_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c"
                     ,0x25d,"ref_matrix_sqrt_abs_m",(ulong)m_upper_tri_local._4_4_,"form inv m");
            }
          }
          else {
            m_upper_tri_local._4_4_ = 4;
          }
        }
        else {
          m_upper_tri_local._4_4_ = 4;
        }
      }
      else {
        m_upper_tri_local._4_4_ = 4;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             0x24c,"ref_matrix_sqrt_abs_m",(ulong)m_upper_tri_local._4_4_,"form m");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x23d,
           "ref_matrix_sqrt_abs_m",(ulong)m_upper_tri_local._4_4_,"diag");
    ref_matrix_show_m(m_upper_tri);
  }
  return m_upper_tri_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_matrix_sqrt_abs_m(REF_DBL *m_upper_tri,
                                                REF_DBL *sqrt_m_upper_tri,
                                                REF_DBL *inv_sqrt_m_upper_tri) {
  REF_DBL d[12];

  RSB(ref_matrix_diag_m(m_upper_tri, d), "diag",
      { ref_matrix_show_m(m_upper_tri); });

  if (d[0] < 0.0 || d[1] < 0.0 || d[2] < 0.0) {
    REF_WHERE("ABS(eigenvalues)");
    printf("eigs %24.15e %24.15e %24.15e\n", d[0], d[1], d[2]);
    ref_matrix_show_m(m_upper_tri);
  }
  d[0] = ABS(d[0]);
  d[1] = ABS(d[1]);
  d[2] = ABS(d[2]);

  d[0] = sqrt(d[0]);
  d[1] = sqrt(d[1]);
  d[2] = sqrt(d[2]);

  RSS(ref_matrix_form_m(d, sqrt_m_upper_tri), "form m");

  if (!ref_math_divisible(1.0, d[0])) {
    return REF_DIV_ZERO;
  }
  d[0] = 1.0 / d[0];

  if (!ref_math_divisible(1.0, d[1])) {
    return REF_DIV_ZERO;
  }
  d[1] = 1.0 / d[1];

  if (!ref_math_divisible(1.0, d[2])) {
    return REF_DIV_ZERO;
  }
  d[2] = 1.0 / d[2];

  RSS(ref_matrix_form_m(d, inv_sqrt_m_upper_tri), "form inv m");

  return REF_SUCCESS;
}